

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::ReplacementVisitor::visit(ReplacementVisitor *this,DirectionalAtom *datom)

{
  undefined1 (*pauVar1) [16];
  double dVar2;
  DataStoragePointer DVar3;
  SnapshotManager *pSVar4;
  Snapshot *pSVar5;
  element_type *peVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar9;
  undefined4 uVar10;
  ulong uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [16];
  bool bVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  undefined1 auVar16 [8];
  ReplacementVisitor *pRVar17;
  uint i;
  iterator iVar18;
  element_type *peVar19;
  ostream *poVar20;
  long lVar21;
  undefined8 *puVar22;
  undefined1 *puVar23;
  uint i_3;
  double (*padVar24) [3];
  undefined8 *puVar25;
  uint j_1;
  double (*__return_storage_ptr__) [3];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar26;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  double *pdVar27;
  uint j;
  long lVar28;
  double *pdVar29;
  uint k;
  long lVar30;
  element_type *peVar31;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var32;
  StuntDouble *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_03;
  pointer psVar33;
  undefined4 uVar34;
  undefined1 auVar35 [16];
  SquareMatrix3<double> result;
  Mat3x3d mat;
  Vector3d newVec;
  Vector<double,_3U> result_5;
  Vector3d vel;
  Vector3d pos;
  Mat3x3d I;
  RotMat3x3d Atrans;
  RotMat3x3d A;
  Mat3x3d skewMat;
  _Base_ptr local_2d8;
  undefined1 local_2c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2c0;
  undefined1 local_2b8 [64];
  key_type local_278;
  double local_258;
  double dStack_250;
  double local_248;
  double dStack_240;
  double local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_228;
  double dStack_220;
  ReplacementVisitor *local_218;
  DirectionalAtom *local_210;
  shared_ptr<OpenMD::GenericData> local_208;
  value_type local_1f8;
  AtomInfo *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  pointer local_1d8;
  double local_1c8 [3];
  element_type *local_1b0;
  double local_1a8 [4];
  double local_188 [4];
  double local_168 [10];
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108 [8];
  undefined8 local_c8 [10];
  double local_78;
  undefined1 auStack_70 [16];
  double dStack_60;
  undefined8 local_58;
  undefined1 auStack_50 [16];
  double dStack_40;
  undefined8 local_38;
  
  local_c8[6] = 0;
  local_c8[7] = 0;
  local_c8[4] = 0;
  local_c8[5] = 0;
  local_c8[2] = 0;
  local_c8[3] = 0;
  local_c8[0] = 0;
  local_c8[1] = 0;
  local_c8[8] = 0;
  local_108[6] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_168[8] = 0.0;
  local_168[6] = 0.0;
  local_168[7] = 0.0;
  local_168[4] = 0.0;
  local_168[5] = 0.0;
  local_168[2] = 0.0;
  local_168[3] = 0.0;
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  local_188[2] = 0.0;
  local_188[0] = 0.0;
  local_188[1] = 0.0;
  local_1a8[2] = 0.0;
  local_1a8[0] = 0.0;
  local_1a8[1] = 0.0;
  local_38 = 0;
  dStack_40 = 0.0;
  local_58 = 0;
  auStack_50 = ZEXT816(0);
  dStack_60 = 0.0;
  local_78 = 0.0;
  auStack_70 = ZEXT816(0);
  local_1d8 = (pointer)0x0;
  local_1e8 = (AtomInfo *)0x0;
  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*(datom->super_Atom).super_StuntDouble._vptr_StuntDouble[7])(local_2b8 + 0x40);
  iVar18 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&(this->myTypes_)._M_t,(key_type *)(local_2b8 + 0x40));
  paVar15 = &local_278.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar15) {
    operator_delete(local_278._M_dataplus._M_p,(ulong)(local_278.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((_Rb_tree_header *)iVar18._M_node == &(this->myTypes_)._M_t._M_impl.super__Rb_tree_header) {
    local_2d8 = (_Base_ptr)0x0;
    this_01._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Var32._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_0022118f;
  }
  local_278._M_dataplus._M_p = (pointer)paVar15;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_2b8 + 0x40),"ATOMDATA","");
  this_02 = (StuntDouble *)local_2c8;
  local_218 = this;
  StuntDouble::getPropertyByName(this_02,(string *)datom);
  this_01._M_pi = _Stack_2c0._M_pi;
  auVar16 = local_2c8;
  _Stack_2c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2c8 = (undefined1  [8])0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != paVar15) {
    operator_delete(local_278._M_dataplus._M_p,(ulong)(local_278.field_2._M_allocated_capacity + 1))
    ;
  }
  if (auVar16 == (undefined1  [8])0x0) {
    local_278._M_dataplus._M_p = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278._M_string_length,
               (AtomData **)(local_2b8 + 0x40),(allocator<OpenMD::AtomData> *)local_2c8);
    local_2b8._56_8_ = local_278._M_dataplus._M_p;
    local_2d8 = (_Base_ptr)local_278._M_string_length;
    local_278._M_dataplus._M_p = (pointer)0x0;
    local_278._M_string_length = 0;
LAB_00220a1e:
    if ((_Base_ptr)local_278._M_string_length != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_278._M_string_length);
    }
    bVar14 = false;
  }
  else {
    peVar19 = (element_type *)__dynamic_cast(auVar16,&GenericData::typeinfo,&AtomData::typeinfo,0);
    local_2b8._56_8_ = (element_type *)0x0;
    _Var32._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(_Base_ptr)0x0;
    if ((peVar19 != (element_type *)0x0) &&
       (local_2b8._56_8_ = peVar19, _Var32._M_pi = this_01._M_pi,
       (_Base_ptr)this_01._M_pi != (_Base_ptr)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      }
    }
    if ((element_type *)local_2b8._56_8_ == (element_type *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"can not get Atom Data from ",0x1b);
      (*(datom->super_Atom).super_StuntDouble._vptr_StuntDouble[7])(local_2b8 + 0x40,datom);
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,local_278._M_dataplus._M_p,
                           local_278._M_string_length);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
      std::ostream::put((char)poVar20);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar15) {
        operator_delete(local_278._M_dataplus._M_p,
                        (ulong)(local_278.field_2._M_allocated_capacity + 1));
      }
      local_278._M_dataplus._M_p = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_278._M_string_length,
                 (AtomData **)(local_2b8 + 0x40),(allocator<OpenMD::AtomData> *)local_2c8);
      local_2b8._56_8_ = local_278._M_dataplus._M_p;
      local_2d8 = (_Base_ptr)local_278._M_string_length;
      local_278._M_dataplus._M_p = (pointer)0x0;
      local_278._M_string_length = 0;
      if ((_Base_ptr)_Var32._M_pi != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var32._M_pi);
      }
      goto LAB_00220a1e;
    }
    bVar14 = true;
    local_2d8 = (_Base_ptr)_Var32._M_pi;
  }
  DVar3 = (datom->super_Atom).super_StuntDouble.storage_;
  pSVar4 = (datom->super_Atom).super_StuntDouble.snapshotMan_;
  pSVar5 = pSVar4->currentSnapshot_;
  lVar21 = *(long *)((long)&(pSVar5->atomData).position.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar3);
  lVar28 = (long)(datom->super_Atom).super_StuntDouble.localIndex_ * 0x18;
  local_188[2] = *(double *)(lVar21 + 0x10 + lVar28);
  pdVar27 = (double *)(lVar21 + lVar28);
  local_188[0] = *pdVar27;
  local_188[1] = pdVar27[1];
  lVar21 = *(long *)((long)&(pSVar5->atomData).velocity.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar3);
  pdVar27 = (double *)(lVar21 + lVar28);
  local_1a8[0] = *pdVar27;
  local_1a8[1] = pdVar27[1];
  local_1a8[2] = *(double *)(lVar21 + 0x10 + lVar28);
  lVar21 = *(long *)((long)&(pSVar4->currentSnapshot_->atomData).angularMomentum.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + DVar3);
  pauVar1 = (undefined1 (*) [16])(lVar21 + lVar28);
  dVar2 = *(double *)*pauVar1;
  uVar11 = *(ulong *)(*pauVar1 + 8);
  auVar13 = *pauVar1;
  local_228 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar21 + 0x10 + lVar28);
  dStack_220 = 0.0;
  (*(datom->super_Atom).super_StuntDouble._vptr_StuntDouble[5])(local_2b8 + 0x40,datom);
  lVar21 = 0;
  do {
    *(undefined8 *)((long)local_168 + lVar21 + 0x10) =
         *(undefined8 *)((long)&local_278.field_2 + lVar21);
    uVar12 = *(undefined8 *)((long)&local_278._M_string_length + lVar21);
    *(undefined8 *)((long)local_168 + lVar21) = *(undefined8 *)(local_2b8 + lVar21 + 0x40);
    *(undefined8 *)((long)local_168 + lVar21 + 8) = uVar12;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x48);
  __return_storage_ptr__ = (double (*) [3])(local_2b8 + 0x40);
  StuntDouble::getA((RotMat3x3d *)__return_storage_ptr__,(StuntDouble *)datom);
  lVar21 = 0;
  do {
    *(undefined8 *)((long)local_c8 + lVar21 + 0x10) =
         *(undefined8 *)((long)&local_278.field_2 + lVar21);
    uVar12 = *(undefined8 *)((long)&local_278._M_string_length + lVar21);
    *(undefined8 *)((long)local_c8 + lVar21) = *(undefined8 *)(local_2b8 + lVar21 + 0x40);
    *(undefined8 *)((long)local_c8 + lVar21 + 8) = uVar12;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x48);
  lVar21 = 0;
  local_78 = 0.0;
  auVar35._8_8_ = uVar11 ^ 0x8000000000000000;
  auVar35._0_8_ = local_228;
  uVar34 = (undefined4)((ulong)local_168[4] >> 0x20);
  auVar7._8_4_ = SUB84(local_168[4],0);
  auVar7._0_8_ = local_168[8];
  auVar7._12_4_ = uVar34;
  auStack_70 = divpd(auVar35,auVar7);
  dStack_60 = -(double)local_228 / local_168[8];
  local_58 = 0;
  auVar8._8_4_ = SUB84(local_168[4],0);
  auVar8._0_8_ = local_168[0];
  auVar8._12_4_ = uVar34;
  auStack_50 = divpd(auVar13,auVar8);
  dStack_40 = -dVar2 / local_168[0];
  local_38 = 0;
  local_2b8._48_8_ = (_func_int **)0x0;
  local_2b8._32_8_ = 0;
  local_2b8._40_8_ = 0.0;
  local_2b8._16_8_ = 0;
  local_2b8._24_4_ = 0;
  local_2b8._28_4_ = 0;
  local_2b8._0_8_ = (pointer)0x0;
  local_2b8._8_8_ = (SnapshotManager *)0x0;
  local_2c8 = (undefined1  [8])0x0;
  _Stack_2c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar22 = local_c8;
  do {
    lVar28 = 0;
    pdVar27 = &local_78;
    do {
      dVar2 = *(double *)(local_2c8 + (lVar21 * 3 + lVar28) * 8);
      lVar30 = 0;
      pdVar29 = pdVar27;
      do {
        dVar2 = dVar2 + (double)puVar22[lVar30] * *pdVar29;
        lVar30 = lVar30 + 1;
        pdVar29 = pdVar29 + 3;
      } while (lVar30 != 3);
      *(double *)(local_2c8 + (lVar21 * 3 + lVar28) * 8) = dVar2;
      lVar28 = lVar28 + 1;
      pdVar27 = pdVar27 + 1;
    } while (lVar28 != 3);
    lVar21 = lVar21 + 1;
    puVar22 = puVar22 + 3;
  } while (lVar21 != 3);
  local_248 = 0.0;
  dStack_240 = 0.0;
  local_258 = 0.0;
  dStack_250 = 0.0;
  local_278.field_2._M_allocated_capacity = 0;
  local_278.field_2._8_8_ = (_Base_ptr)0x0;
  local_278._M_dataplus._M_p = (pointer)0x0;
  local_278._M_string_length = 0;
  local_238 = 0.0;
  lVar21 = 0;
  do {
    lVar28 = 0;
    padVar24 = __return_storage_ptr__;
    do {
      (((SquareMatrix<double,_3> *)*padVar24)->super_RectMatrix<double,_3U,_3U>).data_[0][0] =
           (double)(&this_02->_vptr_StuntDouble)[lVar28];
      lVar28 = lVar28 + 1;
      padVar24 = padVar24 + 1;
    } while (lVar28 != 3);
    lVar21 = lVar21 + 1;
    __return_storage_ptr__ = (double (*) [3])(*__return_storage_ptr__ + 1);
    this_02 = (StuntDouble *)&this_02->snapshotMan_;
  } while (lVar21 != 3);
  puVar22 = (undefined8 *)local_2c8;
  local_2b8._32_8_ = 0;
  local_2b8._40_8_ = 0.0;
  local_2b8._16_8_ = 0;
  local_2b8._24_4_ = 0;
  local_2b8._28_4_ = 0;
  local_2b8._0_8_ = (pointer)0x0;
  local_2b8._8_8_ = (SnapshotManager *)0x0;
  local_2c8 = (undefined1  [8])0x0;
  _Stack_2c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_2b8._48_8_ = (_func_int **)0x0;
  puVar25 = local_c8;
  lVar21 = 0;
  do {
    lVar28 = 0;
    puVar26 = puVar22;
    do {
      *puVar26 = puVar25[lVar28];
      lVar28 = lVar28 + 1;
      puVar26 = puVar26 + 3;
    } while (lVar28 != 3);
    lVar21 = lVar21 + 1;
    puVar22 = puVar22 + 1;
    puVar25 = puVar25 + 3;
  } while (lVar21 != 3);
  lVar21 = 0;
  do {
    *(undefined8 *)((long)local_108 + lVar21) = *(undefined8 *)(local_2b8 + lVar21);
    uVar34 = *(undefined4 *)(local_2c8 + lVar21 + 4);
    uVar9 = *(undefined4 *)((long)&_Stack_2c0._M_pi + lVar21);
    uVar10 = *(undefined4 *)((long)&_Stack_2c0._M_pi + lVar21 + 4);
    *(undefined4 *)((long)&local_118 + lVar21) = *(undefined4 *)(local_2c8 + lVar21);
    *(undefined4 *)((long)&local_118 + lVar21 + 4) = uVar34;
    *(undefined4 *)((long)&uStack_110 + lVar21) = uVar9;
    *(undefined4 *)((long)&uStack_110 + lVar21 + 4) = uVar10;
    lVar21 = lVar21 + 0x18;
  } while (lVar21 != 0x48);
  local_210 = datom;
  peVar6 = (local_218->sites_).super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  psVar33 = (peVar6->data).
            super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (psVar33 ==
      (peVar6->data).
      super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    peVar31 = (element_type *)0x0;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    peVar31 = (psVar33->super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = (psVar33->super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  if (peVar31 == (element_type *)0x0) {
    _Var32._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_1b0 = (element_type *)(local_2b8._56_8_ + 0x28);
    this_03._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    do {
      local_2c8 = (undefined1  [8])0x0;
      _Stack_2c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2b8._0_8_ = (pointer)0x0;
      puVar22 = &local_118;
      lVar21 = 0;
      do {
        dVar2 = *(double *)(local_2c8 + lVar21 * 8);
        lVar28 = 0;
        do {
          dVar2 = dVar2 + (double)puVar22[lVar28] *
                          (peVar31->pos).super_Vector<double,_3U>.data_[lVar28];
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        *(double *)(local_2c8 + lVar21 * 8) = dVar2;
        lVar21 = lVar21 + 1;
        puVar22 = puVar22 + 3;
      } while (lVar21 != 3);
      local_1d8 = (pointer)local_2b8._0_8_;
      local_1e8 = (AtomInfo *)local_2c8;
      p_Stack_1e0 = _Stack_2c0._M_pi;
      local_2c8 = (undefined1  [8])0x0;
      local_228 = this_00;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<OpenMD::AtomInfo,std::allocator<OpenMD::AtomInfo>>
                (&_Stack_2c0,(AtomInfo **)local_2c8,(allocator<OpenMD::AtomInfo> *)local_1c8);
      _Var32._M_pi = _Stack_2c0._M_pi;
      auVar16 = local_2c8;
      local_2c8 = (undefined1  [8])0x0;
      _Stack_2c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_03._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03._M_pi);
      }
      if (_Stack_2c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2c0._M_pi);
      }
      std::__cxx11::string::_M_assign((string *)auVar16);
      pRVar17 = local_218;
      local_2c8 = (undefined1  [8])0x0;
      _Stack_2c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2b8._0_8_ = (pointer)0x0;
      lVar21 = 0;
      do {
        *(double *)(local_2c8 + lVar21 * 8) = local_188[lVar21] + (double)(&local_1e8)[lVar21];
        lVar21 = lVar21 + 1;
      } while (lVar21 != 3);
      (((Vector3d *)((long)auVar16 + 0x28))->super_Vector<double,_3U>).data_[2] =
           (double)local_2b8._0_8_;
      (((Vector3d *)((long)auVar16 + 0x28))->super_Vector<double,_3U>).data_[0] = (double)local_2c8;
      (((Vector3d *)((long)auVar16 + 0x28))->super_Vector<double,_3U>).data_[1] =
           (double)_Stack_2c0._M_pi;
      if (peVar31->hasVector == true) {
        local_2c8 = (undefined1  [8])0x0;
        _Stack_2c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_2b8._0_8_ = (pointer)0x0;
        puVar22 = &local_118;
        lVar21 = 0;
        do {
          dVar2 = *(double *)(local_2c8 + lVar21 * 8);
          lVar28 = 0;
          do {
            dVar2 = dVar2 + (double)puVar22[lVar28] *
                            (peVar31->vec).super_Vector<double,_3U>.data_[lVar28];
            lVar28 = lVar28 + 1;
          } while (lVar28 != 3);
          *(double *)(local_2c8 + lVar21 * 8) = dVar2;
          lVar21 = lVar21 + 1;
          puVar22 = puVar22 + 3;
        } while (lVar21 != 3);
        local_1d8 = (pointer)local_2b8._0_8_;
        local_1e8 = (AtomInfo *)local_2c8;
        p_Stack_1e0 = _Stack_2c0._M_pi;
        (((Vector3d *)((long)auVar16 + 0x40))->super_Vector<double,_3U>).data_[2] =
             (double)local_2b8._0_8_;
        (((Vector3d *)((long)auVar16 + 0x40))->super_Vector<double,_3U>).data_[0] =
             (double)local_2c8;
        (((Vector3d *)((long)auVar16 + 0x40))->super_Vector<double,_3U>).data_[1] =
             (double)_Stack_2c0._M_pi;
      }
      else if ((Vector3d *)((long)auVar16 + 0x40) != (Vector3d *)&OpenMD::V3Zero) {
        lVar21 = 0;
        do {
          *(undefined8 *)
           ((long)(((Vector3d *)((long)auVar16 + 0x40))->super_Vector<double,_3U>).data_ + lVar21) =
               *(undefined8 *)((long)&OpenMD::V3Zero + lVar21);
          lVar21 = lVar21 + 8;
        } while (lVar21 != 0x18);
      }
      local_1c8[0] = 0.0;
      local_1c8[1] = 0.0;
      local_1c8[2] = 0.0;
      puVar23 = local_2b8 + 0x40;
      lVar21 = 0;
      do {
        dVar2 = local_1c8[lVar21];
        lVar28 = 0;
        do {
          dVar2 = dVar2 + *(double *)(puVar23 + lVar28 * 8) *
                          (peVar31->pos).super_Vector<double,_3U>.data_[lVar28];
          lVar28 = lVar28 + 1;
        } while (lVar28 != 3);
        local_1c8[lVar21] = dVar2;
        lVar21 = lVar21 + 1;
        puVar23 = puVar23 + 0x18;
      } while (lVar21 != 3);
      local_2c8 = (undefined1  [8])0x0;
      _Stack_2c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2b8._0_8_ = (pointer)0x0;
      lVar21 = 0;
      do {
        *(double *)(local_2c8 + lVar21 * 8) = local_1a8[lVar21] + local_1c8[lVar21];
        lVar21 = lVar21 + 1;
      } while (lVar21 != 3);
      (((Vector3d *)((long)auVar16 + 0x58))->super_Vector<double,_3U>).data_[2] =
           (double)local_2b8._0_8_;
      (((Vector3d *)((long)auVar16 + 0x58))->super_Vector<double,_3U>).data_[0] = (double)local_2c8;
      (((Vector3d *)((long)auVar16 + 0x58))->super_Vector<double,_3U>).data_[1] =
           (double)_Stack_2c0._M_pi;
      *(bool *)((long)auVar16 + 0xaa) = true;
      local_1f8.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)auVar16;
      local_1f8.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           _Var32._M_pi;
      if (_Var32._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Var32._M_pi)->_M_use_count = (_Var32._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Var32._M_pi)->_M_use_count = (_Var32._M_pi)->_M_use_count + 1;
        }
      }
      std::
      vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
      ::push_back((vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                   *)local_1b0,&local_1f8);
      if (local_1f8.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f8.super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (psVar33 + 1 ==
          (((pRVar17->sites_).super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr)->data).
          super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        peVar31 = (element_type *)0x0;
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        peVar31 = psVar33[1].super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        this_00 = psVar33[1].super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
      }
      if (local_228 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_228);
      }
      this_03._M_pi = _Var32._M_pi;
      psVar33 = psVar33 + 1;
    } while (peVar31 != (element_type *)0x0);
  }
  pRVar17 = local_218;
  if (!bVar14) {
    local_2c8 = (undefined1  [8])local_2b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"ATOMDATA","");
    uVar12 = local_2b8._56_8_;
    std::__cxx11::string::_M_assign((string *)(local_2b8._56_8_ + 8));
    if (local_2c8 != (undefined1  [8])local_2b8) {
      operator_delete((void *)local_2c8,(ulong)(local_2b8._0_8_ + 1));
    }
    local_208.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar12;
    local_208.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8;
    if (local_2d8 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&local_2d8->_M_parent = *(int *)&local_2d8->_M_parent + 1;
        UNLOCK();
      }
      else {
        *(int *)&local_2d8->_M_parent = *(int *)&local_2d8->_M_parent + 1;
      }
    }
    StuntDouble::addProperty((StuntDouble *)local_210,&local_208);
    if ((_Base_ptr)
        local_208.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Base_ptr)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_208.super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  BaseAtomVisitor::setVisited(&pRVar17->super_BaseAtomVisitor,&local_210->super_Atom);
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_0022118f:
  if ((_Base_ptr)this_01._M_pi != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  if (local_2d8 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8);
  }
  if (_Var32._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var32._M_pi);
  }
  return;
}

Assistant:

void ReplacementVisitor::visit(DirectionalAtom* datom) {
    RotMat3x3d A;
    RotMat3x3d Atrans;
    Mat3x3d I;
    Vector3d pos;
    Vector3d vel;
    Vector3d frc;
    Vector3d trq;
    Vector3d j;
    Mat3x3d skewMat;

    Vector3d newVec;
    std::shared_ptr<AtomInfo> atomInfo;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<GenericData> data;
    bool haveAtomData;

    // if atom is not one of our recognized atom types, just skip it
    if (!isReplacedAtom(datom->getType())) return;

    data = datom->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) {
        std::cerr << "can not get Atom Data from " << datom->getType()
                  << std::endl;
        atomData     = std::make_shared<AtomData>();
        haveAtomData = false;
      } else
        haveAtomData = true;
    } else {
      atomData     = std::make_shared<AtomData>();
      haveAtomData = false;
    }

    pos = datom->getPos();
    vel = datom->getVel();

    j = datom->getJ();
    I = datom->getI();
    A = datom->getA();

    skewMat(0, 0) = 0;
    skewMat(0, 1) = j[2] / I(2, 2);
    skewMat(0, 2) = -j[1] / I(1, 1);
    skewMat(1, 0) = -j[2] / I(2, 2);
    skewMat(1, 1) = 0;
    skewMat(1, 2) = j[0] / I(0, 0);
    skewMat(2, 0) = j[1] / I(1, 1);
    skewMat(2, 1) = -j[0] / I(0, 0);
    skewMat(2, 2) = 0;
    Mat3x3d mat   = (A * skewMat).transpose();

    // We need A^T to convert from body-fixed to space-fixed:
    Atrans = A.transpose();

    std::shared_ptr<AtomInfo> siteInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator iter;

    for (siteInfo = sites_->beginAtomInfo(iter); siteInfo;
         siteInfo = sites_->nextAtomInfo(iter)) {
      newVec = Atrans * siteInfo->pos;

      atomInfo               = std::make_shared<AtomInfo>();
      atomInfo->atomTypeName = siteInfo->atomTypeName;
      atomInfo->pos          = pos + newVec;

      if (siteInfo->hasVector) {
        newVec        = Atrans * siteInfo->vec;
        atomInfo->vec = newVec;
      } else {
        atomInfo->vec = V3Zero;
      }

      atomInfo->vel         = vel + mat * siteInfo->pos;
      atomInfo->hasVelocity = true;

      atomData->addAtomInfo(atomInfo);
    }
    if (!haveAtomData) {
      atomData->setID("ATOMDATA");
      datom->addProperty(atomData);
    }

    setVisited(datom);
  }